

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O0

int CheckCompressBig1(void)

{
  uint uVar1;
  int iVar2;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  byte local_d;
  int expectedLength;
  uchar c;
  uint bits;
  
  uVar1 = CalcFib(0);
  expectedLength = uVar1 * (AlphabetSize - 1);
  for (local_d = 1; local_d < AlphabetSize; local_d = local_d + 1) {
    uVar1 = CalcFib((uint)local_d);
    expectedLength = uVar1 * (AlphabetSize - local_d) + expectedLength;
  }
  iVar2 = AlphabetSize * 10;
  if (AlphabetSize == 0x10) {
    local_18 = 0x15;
  }
  else {
    if (AlphabetSize == 0x15) {
      local_1c = 0x1a;
    }
    else {
      if (AlphabetSize == 0x1a) {
        local_20 = 0x1f;
      }
      else {
        if (AlphabetSize == 0x1f) {
          local_24 = 0x23;
        }
        else {
          local_24 = 0x29;
        }
        local_20 = local_24;
      }
      local_1c = local_20;
    }
    local_18 = local_1c;
  }
  AlphabetSize = local_18;
  iVar2 = CheckCompress((long)(int)((iVar2 + expectedLength + 7U >> 3) + 4));
  return iVar2;
}

Assistant:

static int CheckCompressBig1(void) {
    unsigned bits = CalcFib(0)*(AlphabetSize-1);
    for (unsigned char c = 1; c < AlphabetSize; ++c) {
        bits += CalcFib(c)*(AlphabetSize-c);
    }
    int expectedLength = 4+(10*AlphabetSize+bits+7)/8;
    AlphabetSize = AlphabetSize == 16 ? 21
        : AlphabetSize == 21 ? 26
        : AlphabetSize == 26 ? 31
        : AlphabetSize == 31 ? 35
        : AlphabetSize == 35 ? 41
        : 41;
    return CheckCompress(expectedLength);
}